

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O3

Expression * __thiscall GetTupleElement::visit_intrinsic(GetTupleElement *this,Intrinsic *intrinsic)

{
  Expression *pEVar1;
  bool bVar2;
  StringView local_28;
  Expression *local_18;
  
  local_28.string = "reference";
  local_28.length = 9;
  bVar2 = Intrinsic::name_equals(intrinsic,&local_28);
  if (bVar2) {
    pEVar1 = *(intrinsic->arguments).
              super__Vector_base<const_Expression_*,_std::allocator<const_Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_28.string = (char *)&PTR_visit_int_literal_00153fd8;
    local_28.length = (size_t)this;
    (*pEVar1->_vptr_Expression[2])(pEVar1,&local_28);
  }
  else {
    local_18 = (Expression *)0x0;
  }
  return local_18;
}

Assistant:

const Expression* visit_intrinsic(const Intrinsic& intrinsic) override {
		if (intrinsic.name_equals("reference")) {
			return visit(*this, intrinsic.get_arguments()[0]);
		}
		return nullptr;
	}